

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O1

int dedotdotify(char *input,size_t clen,char **outp)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  char **ppcVar4;
  CURLcode CVar5;
  void *pvVar6;
  size_t sVar7;
  char *pcVar8;
  int iVar9;
  ulong uVar10;
  dynbuf out;
  dynbuf dStack_68;
  char *local_48;
  size_t local_40;
  char **local_38;
  
  *outp = (char *)0x0;
  if (clen < 2) {
    return 0;
  }
  Curl_dyn_init(&dStack_68,clen + 1);
  if (*input == '.') {
    input = input + 1;
    clen = clen - 1;
LAB_001699ab:
    bVar2 = true;
  }
  else {
    if (((*input == '%' && clen != 2) && (input[1] == '2')) && ((input[2] & 0xdfU) == 0x45)) {
      input = input + 3;
      clen = clen - 3;
      goto LAB_001699ab;
    }
    bVar2 = false;
  }
  if (bVar2) {
    if (clen == 0) {
LAB_00169a60:
      bVar3 = false;
    }
    else {
      cVar1 = *input;
      if (cVar1 == '.') {
        pcVar8 = input + 1;
        uVar10 = clen - 1;
LAB_00169a09:
        bVar2 = true;
LAB_00169a41:
        bVar3 = true;
        if (bVar2) {
          if (uVar10 == 0) goto LAB_00169a60;
          if (*pcVar8 == '/') {
            input = pcVar8 + 1;
            clen = uVar10 - 1;
          }
        }
      }
      else {
        if (cVar1 != '/') {
          if (((cVar1 == '%' && 2 < clen) && (input[1] == '2')) && ((input[2] & 0xdfU) == 0x45)) {
            pcVar8 = input + 3;
            uVar10 = clen - 3;
            goto LAB_00169a09;
          }
          bVar2 = false;
          pcVar8 = input;
          uVar10 = clen;
          goto LAB_00169a41;
        }
        input = input + 1;
        clen = clen - 1;
        bVar3 = true;
      }
    }
    if (!bVar3) {
      CVar5 = CURLE_OK;
      goto LAB_00169c03;
    }
  }
  CVar5 = CURLE_OK;
  ppcVar4 = outp;
  if (clen != 0) {
    do {
      local_38 = ppcVar4;
      pcVar8 = input;
      if (*input == '/') {
        if (input[1] == '.') {
          pcVar8 = input + 2;
          uVar10 = clen - 2;
LAB_00169a98:
          bVar2 = true;
        }
        else {
          pcVar8 = input + 1;
          uVar10 = clen - 1;
          bVar2 = false;
          if ((2 < uVar10) && (input[1] == '%')) {
            if ((input[2] == '2') && ((input[3] & 0xdfU) == 0x45)) {
              pcVar8 = input + 4;
              uVar10 = clen - 4;
              goto LAB_00169a98;
            }
            bVar2 = false;
          }
        }
        if (bVar2) {
          if (uVar10 == 0) {
LAB_00169b88:
            CVar5 = Curl_dyn_addn(&dStack_68,"/",1);
            iVar9 = 4;
            pcVar8 = input;
            uVar10 = clen;
          }
          else {
            cVar1 = *pcVar8;
            iVar9 = 3;
            if (cVar1 != '/') {
              if (cVar1 == '.') {
                pcVar8 = pcVar8 + 1;
                uVar10 = uVar10 - 1;
LAB_00169af8:
                bVar2 = true;
              }
              else {
                bVar2 = false;
                if ((2 < uVar10) && (cVar1 == '%')) {
                  if ((pcVar8[1] == '2') && ((pcVar8[2] & 0xdfU) == 0x45)) {
                    pcVar8 = pcVar8 + 3;
                    uVar10 = uVar10 - 3;
                    goto LAB_00169af8;
                  }
                  bVar2 = false;
                }
              }
              if ((!bVar2) || ((uVar10 != 0 && (*pcVar8 != '/')))) goto LAB_00169b32;
              sVar7 = Curl_dyn_len(&dStack_68);
              if (sVar7 != 0) {
                local_40 = sVar7;
                local_48 = Curl_dyn_ptr(&dStack_68);
                pvVar6 = memrchr(local_48,0x2f,local_40);
                if (pvVar6 != (void *)0x0) {
                  Curl_dyn_setlen(&dStack_68,(long)pvVar6 - (long)local_48);
                }
              }
              if (uVar10 == 0) goto LAB_00169b88;
            }
          }
        }
        else {
LAB_00169b32:
          iVar9 = 0;
          pcVar8 = input;
          uVar10 = clen;
        }
        clen = uVar10;
        if (iVar9 == 0) goto LAB_00169bc3;
        if (iVar9 != 3) goto LAB_00169bf4;
      }
      else {
LAB_00169bc3:
        CVar5 = Curl_dyn_addn(&dStack_68,pcVar8,1);
        pcVar8 = pcVar8 + 1;
        clen = clen - 1;
      }
      if ((clen == 0) || (input = pcVar8, ppcVar4 = local_38, CVar5 != CURLE_OK)) goto LAB_00169bf4;
    } while( true );
  }
LAB_00169c03:
  if ((char)CVar5 == '\0') {
    sVar7 = Curl_dyn_len(&dStack_68);
    if (sVar7 == 0) {
      pcVar8 = (*Curl_cstrdup)("");
      *outp = pcVar8;
      if (pcVar8 == (char *)0x0) {
        CVar5 = CURLE_UNSUPPORTED_PROTOCOL;
      }
    }
    else {
      pcVar8 = Curl_dyn_ptr(&dStack_68);
      *outp = pcVar8;
    }
  }
  return CVar5;
LAB_00169bf4:
  CVar5 = (CURLcode)(CVar5 != CURLE_OK);
  outp = local_38;
  goto LAB_00169c03;
}

Assistant:

UNITTEST int dedotdotify(const char *input, size_t clen, char **outp)
{
  struct dynbuf out;
  CURLcode result = CURLE_OK;

  *outp = NULL;
  /* the path always starts with a slash, and a slash has not dot */
  if(clen < 2)
    return 0;

  Curl_dyn_init(&out, clen + 1);

  /*  A. If the input buffer begins with a prefix of "../" or "./", then
      remove that prefix from the input buffer; otherwise, */
  if(is_dot(&input, &clen)) {
    const char *p = input;
    size_t blen = clen;

    if(!clen)
      /* . [end] */
      goto end;
    else if(ISSLASH(*p)) {
      /* one dot followed by a slash */
      input = p + 1;
      clen--;
    }

    /*  D. if the input buffer consists only of "." or "..", then remove
        that from the input buffer; otherwise, */
    else if(is_dot(&p, &blen)) {
      if(!blen)
        /* .. [end] */
        goto end;
      else if(ISSLASH(*p)) {
        /* ../ */
        input = p + 1;
        clen = blen - 1;
      }
    }
  }

  while(clen && !result) { /* until end of path content */
    if(ISSLASH(*input)) {
      const char *p = &input[1];
      size_t blen = clen - 1;
      /*  B. if the input buffer begins with a prefix of "/./" or "/.", where
          "."  is a complete path segment, then replace that prefix with "/" in
          the input buffer; otherwise, */
      if(is_dot(&p, &blen)) {
        if(!blen) { /* /. */
          result = Curl_dyn_addn(&out, "/", 1);
          break;
        }
        else if(ISSLASH(*p)) { /* /./ */
          input = p;
          clen = blen;
          continue;
        }

        /*  C. if the input buffer begins with a prefix of "/../" or "/..",
            where ".." is a complete path segment, then replace that prefix
            with "/" in the input buffer and remove the last segment and its
            preceding "/" (if any) from the output buffer; otherwise, */
        else if(is_dot(&p, &blen) && (ISSLASH(*p) || !blen)) {
          /* remove the last segment from the output buffer */
          size_t len = Curl_dyn_len(&out);
          if(len) {
            char *ptr = Curl_dyn_ptr(&out);
            char *last = memrchr(ptr, '/', len);
            if(last)
              /* trim the output at the slash */
              Curl_dyn_setlen(&out, last - ptr);
          }

          if(blen) { /* /../ */
            input = p;
            clen = blen;
            continue;
          }
          result = Curl_dyn_addn(&out, "/", 1);
          break;
        }
      }
    }

    /*  E. move the first path segment in the input buffer to the end of
        the output buffer, including the initial "/" character (if any) and
        any subsequent characters up to, but not including, the next "/"
        character or the end of the input buffer. */

    result = Curl_dyn_addn(&out, input, 1);
    input++;
    clen--;
  }
end:
  if(!result) {
    if(Curl_dyn_len(&out))
      *outp = Curl_dyn_ptr(&out);
    else {
      *outp = strdup("");
      if(!*outp)
        return 1;
    }
  }
  return result ? 1 : 0; /* success */
}